

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::save_to_stream(CVmObjGramProd *this,CVmStream *fp)

{
  vmgram_alt_info *pvVar1;
  vm_gram_ext *pvVar2;
  long *in_RSI;
  CVmObjGramProd *in_RDI;
  size_t k;
  size_t j;
  vmgram_tok_info *tok;
  vmgram_alt_info *alt;
  size_t i;
  vmgram_alt_info **altp;
  ulong local_40;
  ulong local_38;
  vmgram_tok_info *local_30;
  ulong local_20;
  vmgram_alt_info **local_18;
  
  pvVar2 = get_ext(in_RDI);
  (**(code **)(*in_RSI + 0x58))(in_RSI,pvVar2->alt_cnt_ & 0xffffffff);
  pvVar2 = get_ext(in_RDI);
  local_18 = pvVar2->alts_;
  for (local_20 = 0; pvVar2 = get_ext(in_RDI), local_20 < pvVar2->alt_cnt_; local_20 = local_20 + 1)
  {
    pvVar1 = *local_18;
    (**(code **)(*in_RSI + 0x50))(in_RSI,pvVar1->score);
    (**(code **)(*in_RSI + 0x50))(in_RSI,pvVar1->badness);
    (**(code **)(*in_RSI + 0x68))(in_RSI,pvVar1->proc_obj);
    (**(code **)(*in_RSI + 0x58))(in_RSI,pvVar1->tok_cnt & 0xffffffff);
    local_30 = pvVar1->toks;
    for (local_38 = 0; local_38 < pvVar1->tok_cnt; local_38 = local_38 + 1) {
      (**(code **)(*in_RSI + 0x58))(in_RSI,local_30->prop);
      (**(code **)(*in_RSI + 0x20))(in_RSI,local_30->typ);
      switch(local_30->typ) {
      case '\x01':
        (**(code **)(*in_RSI + 0x68))(in_RSI,(local_30->typinfo).prod_obj);
        break;
      case '\x02':
        (**(code **)(*in_RSI + 0x58))(in_RSI,(local_30->typinfo).speech_prop);
        break;
      case '\x03':
        (**(code **)(*in_RSI + 0x58))(in_RSI,(local_30->typinfo).lit.len & 0xffffffff);
        (**(code **)(*in_RSI + 0x88))
                  (in_RSI,(local_30->typinfo).nspeech.cnt,(local_30->typinfo).nspeech.props);
        break;
      case '\x04':
        (**(code **)(*in_RSI + 0x68))(in_RSI,(local_30->typinfo).prod_obj);
        break;
      case '\x05':
        break;
      case '\x06':
        (**(code **)(*in_RSI + 0x58))(in_RSI,(local_30->typinfo).nspeech.cnt & 0xffffffff);
        for (local_40 = 0; local_40 < (local_30->typinfo).nspeech.cnt; local_40 = local_40 + 1) {
          (**(code **)(*in_RSI + 0x58))(in_RSI,(local_30->typinfo).nspeech.props[local_40]);
        }
      }
      local_30 = local_30 + 1;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void CVmObjGramProd::save_to_stream(VMG_ CVmStream *fp)
{
    /* write the number of alternatives */
    fp->write_uint2(get_ext()->alt_cnt_);

    /* write the alternatives */
    vmgram_alt_info **altp = get_ext()->alts_;
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i, ++altp)
    {
        /* get the alternative pointer */
        vmgram_alt_info *alt = *altp;
        
        /* write the alternative header */
        fp->write_int2(alt->score);
        fp->write_int2(alt->badness);
        fp->write_uint4((ulong)alt->proc_obj);
        fp->write_uint2(alt->tok_cnt);
        
        /* write the token list */
        vmgram_tok_info *tok = alt->toks;
        for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
        {
            /* write the fixed part of the token */
            fp->write_uint2((uint)tok->prop);
            fp->write_byte((uchar)tok->typ);
            
            /* write the extra data according to the token type */
            switch (tok->typ)
            {
            case VMGRAM_MATCH_PROD:
                /* write the object ID */
                fp->write_uint4((ulong)tok->typinfo.prod_obj);
                break;
                
            case VMGRAM_MATCH_SPEECH:
                /* write the part-of-speech property */
                fp->write_uint2((uint)tok->typinfo.speech_prop);
                break;
                
            case VMGRAM_MATCH_NSPEECH:
                /* array of part-of-speech properties - write the count */
                fp->write_uint2(tok->typinfo.nspeech.cnt);
                
                /* write the array elements */
                for (size_t k = 0 ; k < tok->typinfo.nspeech.cnt ; ++k)
                    fp->write_uint2((uint)tok->typinfo.nspeech.props[k]);
                
                /* done */
                break;
                
            case VMGRAM_MATCH_LITERAL:
                /* literal string - write the length, then the bytes */
                fp->write_uint2(tok->typinfo.lit.len);
                fp->write_bytes(tok->typinfo.lit.str, tok->typinfo.lit.len);
                break;
                
            case VMGRAM_MATCH_TOKTYPE:
                /* token type */
                fp->write_uint4((ulong)tok->typinfo.toktyp_enum);
                break;
                
            case VMGRAM_MATCH_STAR:
                /* star - no additional data */
                break;
            }
        }
    }
}